

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

int tbx_index_build(char *fn,int min_shift,tbx_conf_t *conf)

{
  int iVar1;
  BGZF *fp_00;
  tbx_t *tbx_00;
  BGZF *fp;
  tbx_t *tbx;
  tbx_conf_t *conf_local;
  int min_shift_local;
  char *fn_local;
  
  iVar1 = bgzf_is_bgzf(fn);
  if (iVar1 == 1) {
    fp_00 = bgzf_open(fn,"r");
    if (fp_00 == (BGZF *)0x0) {
      fn_local._4_4_ = -1;
    }
    else if ((*(int *)fp_00 << 1) >> 0x1e == 0) {
      bgzf_close(fp_00);
      fn_local._4_4_ = -1;
    }
    else {
      tbx_00 = tbx_index(fp_00,min_shift,conf);
      bgzf_close(fp_00);
      if (tbx_00 == (tbx_t *)0x0) {
        fn_local._4_4_ = -1;
      }
      else {
        iVar1 = 2;
        if (0 < min_shift) {
          iVar1 = 0;
        }
        hts_idx_save(tbx_00->idx,fn,iVar1);
        tbx_destroy(tbx_00);
        fn_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"Not a BGZF file: %s\n",fn);
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int tbx_index_build(const char *fn, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    BGZF *fp;
    if ( bgzf_is_bgzf(fn)!=1 ) { fprintf(stderr,"Not a BGZF file: %s\n", fn); return -1; }
    if ((fp = bgzf_open(fn, "r")) == 0) return -1;
    if ( !fp->is_compressed ) { bgzf_close(fp); return -1; }
    tbx = tbx_index(fp, min_shift, conf);
    bgzf_close(fp);
    if ( !tbx ) return -1;
    hts_idx_save(tbx->idx, fn, min_shift > 0? HTS_FMT_CSI : HTS_FMT_TBI);
    tbx_destroy(tbx);
    return 0;
}